

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.hpp
# Opt level: O0

Interface * __thiscall helics::Interface::operator=(Interface *this,Interface *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Interface *in_RDI;
  
  in_RDI->mCore = (Core *)in_RSI->_M_string_length;
  (in_RDI->handle).hid = *(BaseType *)&in_RSI->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return in_RDI;
}

Assistant:

class HELICS_CXX_EXPORT Interface {
  protected:
    Core* mCore{nullptr};  //!< pointer to the core object
    InterfaceHandle handle{};  //!< the id as generated by the Federate
    std::string mName;  //!< the name or key of the interface
  public:
    Interface() = default;
    Interface(Federate* federate, InterfaceHandle hid, std::string_view actName);
    Interface(Core* core, InterfaceHandle hid, std::string_view actName):
        mCore(core), handle(hid), mName(actName)
    {
    }
    virtual ~Interface() = default;
    /** get the underlying handle that can be used to make direct calls to the Core API
     */
    InterfaceHandle getHandle() const { return handle; }
    /** implicit conversion operator for extracting the handle*/
    operator InterfaceHandle() const { return handle; }
    /** check if the Publication links to a valid operation*/
    bool isValid() const { return handle.isValid(); }
    bool operator<(const Interface& inp) const { return (handle < inp.handle); }
    bool operator>(const Interface& inp) const { return (handle > inp.handle); }
    bool operator==(const Interface& inp) const { return (handle == inp.handle); }
    bool operator!=(const Interface& inp) const { return (handle != inp.handle); }
    /** get the Name/Key for the input
    @details the name is the local name if given, key is the full key name*/
    const std::string& getLocalName() const { return mName; }
    /** get the Name/Key for the input
    @details the name is the local name if given, key is the full key name*/
    const std::string& getName() const;
    /** get an associated target*/
    [[deprecated]] const std::string& getTarget() const;
    /** add a source of information to an interface*/
    void addSourceTarget(std::string_view newTarget, InterfaceType hint = InterfaceType::UNKNOWN);
    /** add destination for data sent via the interface*/
    void addDestinationTarget(std::string_view newTarget,
                              InterfaceType hint = InterfaceType::UNKNOWN);
    /** remove a named interface from the target lists*/
    void removeTarget(std::string_view targetToRemove);
    /** add an alternate global name for an interface*/
    void addAlias(std::string_view alias);
    /** get the interface information field of the input*/
    const std::string& getInfo() const;
    /** set the interface information field of the input*/
    void setInfo(std::string_view info);
    /** set a tag (key-value pair) for an interface
    @details the tag is an arbitrary user defined string and value; the tags for an interface are
    queryable
    @param tag the name of the tag to set the value for
    @param value the value for the given tag*/
    void setTag(std::string_view tag, std::string_view value);
    /** get the value of a specific tag (key-value pair) for an interface
    @details the tag is an arbitrary user defined string and value; the tags for an interface are
    queryable
    @param tag the name of the tag to get the value for
    @return a const std::string& containing the value of the tag, if the tag is not defined the
    value is an empty string*/
    const std::string& getTag(std::string_view tag) const;
    /** set a handle flag for the input*/
    virtual void setOption(int32_t option, int32_t value = 1);

    /** get the current value of a flag for the handle*/
    virtual int32_t getOption(int32_t option) const;

    /** get the injection type for an interface,  this is the type for data coming into an interface
    @details for filters this is the input type, for publications this is the type used to transmit
    data, for endpoints this is the specified type and for inputs this is the type of the
    transmitting publication
    @return a const ref to  std::string  */
    const std::string& getInjectionType() const;

    /** get the extraction type for an interface,  this is the type for data coming out of an
    interface
    @details for filters this is the output type, for publications this is the specified type, for
    endpoints this is the specified type and for inputs this is the specified type
    @return a const ref to  std::string  */
    const std::string& getExtractionType() const;

    /** get the injection units for an interface,  this is the units associated with data coming
  into an interface
  @details for inputs this is the input type, for publications this is the units used to transmit
  data, and for inputs this is the units of the transmitting publication
  @return a const ref to  std::string  */
    const std::string& getInjectionUnits() const;

    /** get the extraction units for an interface,  this is the units associated with data coming
    out of an interface
    @details for publications this is the specified units, for inputs this is the specified type
    @return a const ref to  std::string  */
    const std::string& getExtractionUnits() const;
    /** get the display name for an input
    @details the name is the given local name or if empty the name of the target*/
    virtual const std::string& getDisplayName() const = 0;
    /** get the source targets for an interface, either the sources for endpoints or inputs, or the
     * source endpoints for a filter*/
    const std::string& getSourceTargets() const;
    /** get the destination targets for an interface, either the destinations of data for endpoints
     * or publications, or the destination endpoints for a filter*/
    const std::string& getDestinationTargets() const;
    /** get the number of source targets*/
    std::size_t getSourceTargetCount() const;
    /** get the number of destination targets*/
    std::size_t getDestinationTargetCount() const;
    /** close the interface*/
    void close();
    /** disconnect the object from the core*/
    void disconnectFromCore();
}